

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

size_t __thiscall
spirv_cross::Compiler::get_declared_struct_size_runtime_array
          (Compiler *this,SPIRType *type,size_t array_size)

{
  bool bVar1;
  uint32_t uVar2;
  CompilerError *this_00;
  TypedID *this_01;
  SPIRType *pSVar3;
  bool *pbVar4;
  uint *puVar5;
  size_t sVar6;
  SPIRType *last_type;
  size_t size;
  size_t array_size_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (!bVar1) {
    last_type = (SPIRType *)get_declared_struct_size(this,type);
    this_01 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::back
                        (&(type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    uVar2 = TypedID::operator_cast_to_unsigned_int(this_01);
    pSVar3 = get<spirv_cross::SPIRType>(this,uVar2);
    bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
    if (!bVar1) {
      pbVar4 = VectorView<bool>::operator[](&(pSVar3->array_size_literal).super_VectorView<bool>,0);
      if ((*pbVar4 & 1U) != 0) {
        puVar5 = VectorView<unsigned_int>::operator[]
                           (&(pSVar3->array).super_VectorView<unsigned_int>,0);
        if (*puVar5 == 0) {
          sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            (&(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
          uVar2 = type_struct_member_array_stride(this,type,(int)sVar6 - 1);
          last_type = (SPIRType *)
                      ((last_type->array).stack_storage.aligned_char + array_size * uVar2 + -0x38);
        }
      }
    }
    return (size_t)last_type;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Declared struct in block cannot be empty.");
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

size_t Compiler::get_declared_struct_size_runtime_array(const SPIRType &type, size_t array_size) const
{
	if (type.member_types.empty())
		SPIRV_CROSS_THROW("Declared struct in block cannot be empty.");

	size_t size = get_declared_struct_size(type);
	auto &last_type = get<SPIRType>(type.member_types.back());
	if (!last_type.array.empty() && last_type.array_size_literal[0] && last_type.array[0] == 0) // Runtime array
		size += array_size * type_struct_member_array_stride(type, uint32_t(type.member_types.size() - 1));

	return size;
}